

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O3

void __thiscall CSipHasher::CSipHasher(CSipHasher *this,uint64_t k0,uint64_t k1)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->v[0] = k0 ^ 0x736f6d6570736575;
  this->v[1] = k1 ^ 0x646f72616e646f6d;
  this->v[2] = k0 ^ 0x6c7967656e657261;
  this->v[3] = k1 ^ 0x7465646279746573;
  this->count = '\0';
  this->tmp = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSipHasher::CSipHasher(uint64_t k0, uint64_t k1)
{
    v[0] = 0x736f6d6570736575ULL ^ k0;
    v[1] = 0x646f72616e646f6dULL ^ k1;
    v[2] = 0x6c7967656e657261ULL ^ k0;
    v[3] = 0x7465646279746573ULL ^ k1;
    count = 0;
    tmp = 0;
}